

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTPNStmBase::gen_code_substm(CTPNStmBase *this,CTPNStm *substm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  CTcTokenizer *pCVar4;
  
  pCVar4 = G_tok;
  uVar1 = *(undefined4 *)((long)&(substm->super_CTPNStmBase).file_ + 4);
  lVar3 = (substm->super_CTPNStmBase).linenum_;
  uVar2 = *(undefined4 *)((long)&(substm->super_CTPNStmBase).linenum_ + 4);
  *(undefined4 *)&G_tok->last_desc_ = *(undefined4 *)&(substm->super_CTPNStmBase).file_;
  *(undefined4 *)((long)&pCVar4->last_desc_ + 4) = uVar1;
  *(int *)&pCVar4->last_linenum_ = (int)lVar3;
  *(undefined4 *)((long)&pCVar4->last_linenum_ + 4) = uVar2;
  (**(substm->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
            (substm,1,1);
  pCVar4 = G_tok;
  lVar3 = this->linenum_;
  G_tok->last_desc_ = this->file_;
  pCVar4->last_linenum_ = lVar3;
  return;
}

Assistant:

void CTPNStmBase::gen_code_substm(CTPNStm *substm)
{
    /* set the error reporting location to refer to the sub-statement */
    G_tok->set_line_info(substm->get_source_desc(),
                         substm->get_source_linenum());

    /* generate code for the sub-statement */
    substm->gen_code(TRUE, TRUE);

    /* restore the error reporting location to the main statement */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());
}